

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chillout.cpp
# Opt level: O0

void __thiscall Debug::Chillout::backtrace(Chillout *this)

{
  PosixCrashHandler *this_00;
  PosixCrashHandler *handler;
  Chillout *this_local;
  
  this_00 = PosixCrashHandler::getInstance();
  PosixCrashHandler::backtrace(this_00);
  return;
}

Assistant:

void Chillout::backtrace() {
#ifdef _WIN32
        WindowsCrashHandler &handler = WindowsCrashHandler::getInstance();
#else
        PosixCrashHandler &handler = PosixCrashHandler::getInstance();
#endif
        handler.backtrace();
    }